

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_builder.cxx
# Opt level: O1

b_edge * __thiscall
xray_re::xr_mesh_builder::find_edge(xr_mesh_builder *this,uint_fast32_t v0,uint_fast32_t v1)

{
  uint uVar1;
  pointer pbVar2;
  pointer puVar3;
  b_edge *in_RAX;
  b_edge *pbVar4;
  ulong uVar5;
  
  pbVar2 = (this->m_edges).
           super__Vector_base<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->m_vertex_edges).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar1 = puVar3[v0];
  do {
    uVar5 = (ulong)uVar1;
    pbVar4 = in_RAX;
    if (uVar5 == 0xffffffff) break;
    pbVar4 = pbVar2 + uVar5;
    uVar1 = pbVar2[uVar5].link;
  } while (pbVar2[uVar5].v1 != v1);
  if (uVar5 == 0xffffffff) {
    uVar1 = puVar3[v1];
    pbVar2 = (this->m_edges).
             super__Vector_base<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      uVar5 = (ulong)uVar1;
      if (uVar5 == 0xffffffff) {
        return (b_edge *)0x0;
      }
      pbVar4 = pbVar2 + uVar5;
      uVar1 = pbVar2[uVar5].link;
    } while (pbVar2[uVar5].v1 != v0);
  }
  return pbVar4;
}

Assistant:

xr_mesh_builder::b_edge* xr_mesh_builder::find_edge(uint_fast32_t v0, uint_fast32_t v1)
{
	for (uint_fast32_t next = m_vertex_edges[v0]; next != BAD_IDX;) {
		b_edge* edge = &m_edges[next];
		if (edge->v1 == v1)
			return edge;
		next = edge->link;
	}
	for (uint_fast32_t next = m_vertex_edges[v1]; next != BAD_IDX;) {
		b_edge* edge = &m_edges[next];
		if (edge->v1 == v0)
			return edge;
		next = edge->link;
	}
	return 0;
}